

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QItemDelegatePrivate * __thiscall
QItemDelegate::decoration(QItemDelegate *this,QStyleOptionViewItem *option,QVariant *variant)

{
  QFlagsStorage<QStyle::StateFlag> state_00;
  Mode MVar1;
  State SVar2;
  int iVar3;
  long in_RDX;
  QItemDelegatePrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  QColor QVar5;
  qreal dpr;
  State state;
  Mode mode;
  QItemDelegatePrivate *d;
  QItemDelegatePrivate *this_00;
  QVariant *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 local_38;
  undefined4 local_30;
  undefined2 uStack_2c;
  QIcon local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QItemDelegate *)0x851e76);
  state_00.i = ::QVariant::userType((QVariant *)0x851e85);
  if (state_00.i == 0x1003) {
    if (decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap == '\0') {
      iVar3 = __cxa_guard_acquire(&decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
      if (iVar3 != 0) {
        QPixmap::QPixmap((QPixmap *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap,
                         (QSize *)(in_RDX + 0x50));
        __cxa_atexit(QPixmap::~QPixmap,
                     decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap,&__dso_handle);
        __cxa_guard_release(&decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
      }
    }
    QVar5 = qvariant_cast<QColor>(in_stack_ffffffffffffff90);
    local_38 = QVar5._0_8_;
    local_18 = local_38;
    local_30 = QVar5.ct._4_4_;
    local_10 = local_30;
    uStack_2c = QVar5.ct._8_2_;
    local_c = uStack_2c;
    QPixmap::fill((QColor *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
    QPixmap::QPixmap((QPixmap *)in_RDI,
                     (QPixmap *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
  }
  else if (state_00.i == 0x1005) {
    local_1c = *(undefined4 *)(in_RDX + 8);
    MVar1 = QItemDelegatePrivate::iconMode(in_RDI,(State)0x1005);
    local_20 = *(undefined4 *)(in_RDX + 8);
    SVar2 = QItemDelegatePrivate::iconState(this_00,(State)state_00.i);
    qVar4 = QStyleHelper::getDpr((QWidget *)this_00);
    qvariant_cast<QIcon>((QVariant *)CONCAT44(MVar1,SVar2));
    QIcon::pixmap((QSize *)in_RDI,qVar4,(Mode)&local_28,(int)in_RDX + 0x50);
    QIcon::~QIcon(&local_28);
  }
  else {
    qvariant_cast<QPixmap>
              ((QVariant *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QItemDelegate::decoration(const QStyleOptionViewItem &option, const QVariant &variant) const
{
    Q_D(const QItemDelegate);
    switch (variant.userType()) {
    case QMetaType::QIcon: {
        QIcon::Mode mode = d->iconMode(option.state);
        QIcon::State state = d->iconState(option.state);
        const auto dpr = QStyleHelper::getDpr(option.widget);
        return qvariant_cast<QIcon>(variant).pixmap(option.decorationSize, dpr, mode, state); }
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        return pixmap; }
    default:
        break;
    }

    return qvariant_cast<QPixmap>(variant);
}